

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O0

int stlrwt_(double *y,int *n,double *fit,double *rw)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int c__2;
  double cmad;
  int mid [2];
  double c9;
  double c1;
  double r__;
  int i__;
  double d__2;
  double d__1;
  int i__1;
  double *rw_local;
  double *fit_local;
  int *n_local;
  double *y_local;
  
  iVar1 = *n;
  for (r__._4_4_ = 1; r__._4_4_ <= iVar1; r__._4_4_ = r__._4_4_ + 1) {
    rw[(long)r__._4_4_ + -1] = ABS(y[(long)r__._4_4_ + -1] - fit[(long)r__._4_4_ + -1]);
  }
  cmad._0_4_ = *n / 2 + 1;
  cmad._4_4_ = (*n - cmad._0_4_) + 1;
  psort_(rw,*n,(int *)&cmad,2);
  dVar2 = (rw[(long)cmad._0_4_ + -1] + rw[(long)cmad._4_4_ + -1]) * 3.0;
  iVar1 = *n;
  for (r__._4_4_ = 1; r__._4_4_ <= iVar1; r__._4_4_ = r__._4_4_ + 1) {
    dVar3 = ABS(y[(long)r__._4_4_ + -1] - fit[(long)r__._4_4_ + -1]);
    if (dVar2 * 0.001 < dVar3) {
      if (dVar2 * 0.999 < dVar3) {
        rw[(long)r__._4_4_ + -1] = 0.0;
      }
      else {
        dVar3 = -(dVar3 / dVar2) * (dVar3 / dVar2) + 1.0;
        rw[(long)r__._4_4_ + -1] = dVar3 * dVar3;
      }
    }
    else {
      rw[(long)r__._4_4_ + -1] = 1.0;
    }
  }
  return 0;
}

Assistant:

int stlrwt_(double *y, int *n, double *fit, double *rw)
{
    /* System generated locals */
    int i__1;
    double d__1, d__2;

    /* Local variables */
    int i__;
    double r__, c1, c9;
    int mid[2];
    double cmad;
	int c__2 = 2;

/* Robustness Weights */
/* 	rw_i := B( |y_i - fit_i| / (6 M) ),   i = 1,2,...,n */
/* 		where B(u) = (1 - u^2)^2  * 1[|u| < 1]   {Tukey's biweight} */
/* 		and   M := median{ |y_i - fit_i| } */
/* Arg */
/* Var */
    /* Parameter adjustments */
    --rw;
    --fit;
    --y;

    /* Function Body */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	rw[i__] = (d__1 = y[i__] - fit[i__], fabs(d__1));
/* L7: */
    }
    mid[0] = *n / 2 + 1;
    mid[1] = *n - mid[0] + 1;
    psort_(&rw[1], *n, mid, c__2);
    cmad = (rw[mid[0]] + rw[mid[1]]) * 3.0;
/*     = 6 * MAD */
    c9 = cmad * .999;
    c1 = cmad * .001;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	r__ = (d__1 = y[i__] - fit[i__], fabs(d__1));
	if (r__ <= c1) {
	    rw[i__] = 1.f;
	} else if (r__ <= c9) {
/* Computing 2nd power */
	    d__2 = r__ / cmad;
/* Computing 2nd power */
	    d__1 = 1.f - d__2 * d__2;
	    rw[i__] = d__1 * d__1;
	} else {
	    rw[i__] = 0.0;
	}
/* L10: */
    }
    return 0;
}